

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
hexdump_reader::perform(hexdump_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  uint64_t uVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  element_type *peVar8;
  ulong uVar9;
  shared_ptr<ReadWriter> local_50 [2];
  undefined1 local_30 [8];
  ReadWriter_ptr rd;
  readercollection *rdlist_local;
  filesystemcollection *fslist_local;
  hexdump_reader *this_local;
  
  rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rdlist;
  if (1 < g_verbose) {
    uVar5 = std::__cxx11::string::c_str();
    uVar1 = this->_ofs;
    sVar2 = this->_storedsize;
    sVar3 = this->_fullsize;
    uVar6 = std::__cxx11::string::c_str();
    printf("dohexdump(%s, %08llx, %08zx, %08zx, %s)\n",uVar5,uVar1,sVar2,sVar3,uVar6);
  }
  readercollection::getbyname
            ((readercollection *)local_30,
             (string *)
             rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar4) {
    peVar8 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_30);
    (*peVar8->_vptr_ReadWriter[4])(peVar8,this->_ofs);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) != 0) {
      std::shared_ptr<ReadWriter>::shared_ptr(local_50,(shared_ptr<ReadWriter> *)local_30);
      dorawhexdump(this,local_50);
      std::shared_ptr<ReadWriter>::~shared_ptr(local_50);
    }
    std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_30);
    return;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "hexdump: invalid rdname";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dohexdump(%s, %08llx, %08zx, %08zx, %s)\n", _readername.c_str(), _ofs, _storedsize, _fullsize, _comptype.c_str());

        ReadWriter_ptr rd= rdlist.getbyname(_readername);
        if (!rd) throw "hexdump: invalid rdname";

        rd->setpos(_ofs);

        if (_comptype.empty())
            dorawhexdump(rd);
#ifndef _NO_COMPRESS
        else
            docomphexdump(rd);
#endif
    }